

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O2

FT_Error TT_Load_Composite_Glyph(TT_Loader loader)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  FT_GlyphLoader loader_00;
  byte *pbVar7;
  FT_SubGlyph pFVar8;
  FT_Error FVar9;
  FT_ULong FVar10;
  FT_Fixed FVar11;
  uint uVar12;
  FT_UInt n_subs;
  FT_Fixed FVar13;
  FT_Fixed FVar14;
  uint uVar15;
  FT_Fixed FVar16;
  byte *pbVar17;
  
  loader_00 = loader->gloader;
  pbVar17 = loader->cursor;
  pbVar7 = loader->limit;
  uVar12 = 0;
  do {
    n_subs = uVar12 + 1;
    FVar9 = FT_GlyphLoader_CheckSubGlyphs(loader_00,n_subs);
    if (FVar9 != 0) {
      return FVar9;
    }
    if (pbVar7 < pbVar17 + 4) {
      return 0x15;
    }
    pFVar8 = (loader_00->current).subglyphs;
    pFVar8[uVar12].arg1 = 0;
    pFVar8[uVar12].arg2 = 0;
    bVar5 = *pbVar17;
    bVar6 = pbVar17[1];
    pFVar8[uVar12].flags = CONCAT11(bVar5,bVar6);
    pFVar8[uVar12].index =
         (uint)(ushort)(*(ushort *)(pbVar17 + 2) << 8 | *(ushort *)(pbVar17 + 2) >> 8);
    iVar4 = (bVar6 & 1) * 2;
    if ((bVar6 & 8) == 0) {
      if ((bVar6 & 0x40) == 0) {
        uVar15 = iVar4 + 2U | (ushort)(CONCAT11(bVar5,bVar6) >> 4) & 8;
      }
      else {
        uVar15 = iVar4 + 6;
      }
    }
    else {
      uVar15 = iVar4 + 4;
    }
    if (pbVar7 < pbVar17 + 4 + uVar15) {
      return 0x15;
    }
    if ((bVar6 & 2) == 0) {
      if ((bVar6 & 1) == 0) {
        pFVar8[uVar12].arg1 = (uint)pbVar17[4];
        uVar15 = (uint)pbVar17[5];
LAB_0016e8ad:
        pbVar17 = pbVar17 + 6;
      }
      else {
        pFVar8[uVar12].arg1 =
             (uint)(ushort)(*(ushort *)(pbVar17 + 4) << 8 | *(ushort *)(pbVar17 + 4) >> 8);
        puVar1 = (ushort *)(pbVar17 + 6);
        pbVar17 = pbVar17 + 8;
        uVar15 = (uint)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
      }
    }
    else {
      if ((bVar6 & 1) == 0) {
        pFVar8[uVar12].arg1 = (int)(char)pbVar17[4];
        uVar15 = (uint)(char)pbVar17[5];
        goto LAB_0016e8ad;
      }
      pFVar8[uVar12].arg1 = (int)(short)((ushort)pbVar17[4] << 8) | (uint)pbVar17[5];
      pbVar2 = pbVar17 + 6;
      pbVar3 = pbVar17 + 7;
      pbVar17 = pbVar17 + 8;
      uVar15 = (int)(short)((ushort)*pbVar2 << 8) | (uint)*pbVar3;
    }
    pFVar8[uVar12].arg2 = uVar15;
    if ((bVar6 & 8) == 0) {
      if ((bVar6 & 0x40) != 0) {
        FVar11 = ((long)(short)((ushort)*pbVar17 << 8) | (ulong)pbVar17[1]) << 2;
        pbVar2 = pbVar17 + 2;
        pbVar3 = pbVar17 + 3;
        pbVar17 = pbVar17 + 4;
        FVar16 = ((long)(short)((ushort)*pbVar2 << 8) | (ulong)*pbVar3) << 2;
        goto LAB_0016e97c;
      }
      if (-1 < (char)bVar6) {
        FVar11 = 0x10000;
        FVar16 = 0x10000;
        goto LAB_0016e97c;
      }
      FVar11 = ((long)(short)((ushort)*pbVar17 << 8) | (ulong)pbVar17[1]) << 2;
      FVar13 = ((long)(short)((ushort)pbVar17[2] << 8) | (ulong)pbVar17[3]) << 2;
      FVar14 = ((long)(short)((ushort)pbVar17[4] << 8) | (ulong)pbVar17[5]) << 2;
      pbVar2 = pbVar17 + 6;
      pbVar3 = pbVar17 + 7;
      pbVar17 = pbVar17 + 8;
      FVar16 = ((long)(short)((ushort)*pbVar2 << 8) | (ulong)*pbVar3) << 2;
    }
    else {
      bVar5 = *pbVar17;
      pbVar2 = pbVar17 + 1;
      pbVar17 = pbVar17 + 2;
      FVar11 = ((long)(short)((ushort)bVar5 << 8) | (ulong)*pbVar2) << 2;
      FVar16 = FVar11;
LAB_0016e97c:
      FVar14 = 0;
      FVar13 = 0;
    }
    pFVar8[uVar12].transform.xx = FVar11;
    pFVar8[uVar12].transform.xy = FVar14;
    pFVar8[uVar12].transform.yx = FVar13;
    pFVar8[uVar12].transform.yy = FVar16;
    uVar12 = n_subs;
    if ((bVar6 & 0x20) == 0) {
      (loader_00->current).num_subglyphs = n_subs;
      FVar10 = FT_Stream_Pos(loader->stream);
      loader->ins_pos = (FT_ULong)(pbVar17 + (FVar10 - (long)pbVar7));
      loader->cursor = pbVar17;
      return 0;
    }
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Composite_Glyph( TT_Loader  loader )
  {
    FT_Error        error;
    FT_Byte*        p       = loader->cursor;
    FT_Byte*        limit   = loader->limit;
    FT_GlyphLoader  gloader = loader->gloader;
    FT_SubGlyph     subglyph;
    FT_UInt         num_subglyphs;


    num_subglyphs = 0;

    do
    {
      FT_Fixed  xx, xy, yy, yx;
      FT_UInt   count;


      /* check that we can load a new subglyph */
      error = FT_GlyphLoader_CheckSubGlyphs( gloader, num_subglyphs + 1 );
      if ( error )
        goto Fail;

      /* check space */
      if ( p + 4 > limit )
        goto Invalid_Composite;

      subglyph = gloader->current.subglyphs + num_subglyphs;

      subglyph->arg1 = subglyph->arg2 = 0;

      subglyph->flags = FT_NEXT_USHORT( p );
      subglyph->index = FT_NEXT_USHORT( p );

      /* check space */
      count = 2;
      if ( subglyph->flags & ARGS_ARE_WORDS )
        count += 2;
      if ( subglyph->flags & WE_HAVE_A_SCALE )
        count += 2;
      else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
        count += 4;
      else if ( subglyph->flags & WE_HAVE_A_2X2 )
        count += 8;

      if ( p + count > limit )
        goto Invalid_Composite;

      /* read arguments */
      if ( subglyph->flags & ARGS_ARE_XY_VALUES )
      {
        if ( subglyph->flags & ARGS_ARE_WORDS )
        {
          subglyph->arg1 = FT_NEXT_SHORT( p );
          subglyph->arg2 = FT_NEXT_SHORT( p );
        }
        else
        {
          subglyph->arg1 = FT_NEXT_CHAR( p );
          subglyph->arg2 = FT_NEXT_CHAR( p );
        }
      }
      else
      {
        if ( subglyph->flags & ARGS_ARE_WORDS )
        {
          subglyph->arg1 = (FT_Int)FT_NEXT_USHORT( p );
          subglyph->arg2 = (FT_Int)FT_NEXT_USHORT( p );
        }
        else
        {
          subglyph->arg1 = (FT_Int)FT_NEXT_BYTE( p );
          subglyph->arg2 = (FT_Int)FT_NEXT_BYTE( p );
        }
      }

      /* read transform */
      xx = yy = 0x10000L;
      xy = yx = 0;

      if ( subglyph->flags & WE_HAVE_A_SCALE )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = xx;
      }
      else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
      }
      else if ( subglyph->flags & WE_HAVE_A_2X2 )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        xy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
      }

      subglyph->transform.xx = xx;
      subglyph->transform.xy = xy;
      subglyph->transform.yx = yx;
      subglyph->transform.yy = yy;

      num_subglyphs++;

    } while ( subglyph->flags & MORE_COMPONENTS );

    gloader->current.num_subglyphs = num_subglyphs;
    FT_TRACE5(( "  %d component%s\n",
                num_subglyphs,
                num_subglyphs > 1 ? "s" : "" ));

#ifdef FT_DEBUG_LEVEL_TRACE
    {
      FT_UInt  i;


      subglyph = gloader->current.subglyphs;

      for ( i = 0; i < num_subglyphs; i++ )
      {
        if ( num_subglyphs > 1 )
          FT_TRACE7(( "    subglyph %d:\n", i ));

        FT_TRACE7(( "      glyph index: %d\n", subglyph->index ));

        if ( subglyph->flags & ARGS_ARE_XY_VALUES )
          FT_TRACE7(( "      offset: x=%d, y=%d\n",
                      subglyph->arg1,
                      subglyph->arg2 ));
        else
          FT_TRACE7(( "      matching points: base=%d, component=%d\n",
                      subglyph->arg1,
                      subglyph->arg2 ));

        if ( subglyph->flags & WE_HAVE_A_SCALE )
          FT_TRACE7(( "      scaling: %f\n",
                      subglyph->transform.xx / 65536.0 ));
        else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
          FT_TRACE7(( "      scaling: x=%f, y=%f\n",
                      subglyph->transform.xx / 65536.0,
                      subglyph->transform.yy / 65536.0 ));
        else if ( subglyph->flags & WE_HAVE_A_2X2 )
          FT_TRACE7(( "      scaling: xx=%f, yx=%f\n"
                      "               xy=%f, yy=%f\n",
                      subglyph->transform.xx / 65536.0,
                      subglyph->transform.yx / 65536.0,
                      subglyph->transform.xy / 65536.0,
                      subglyph->transform.yy / 65536.0 ));

        subglyph++;
      }
    }
#endif /* FT_DEBUG_LEVEL_TRACE */

#ifdef TT_USE_BYTECODE_INTERPRETER

    {
      FT_Stream  stream = loader->stream;


      /* we must undo the FT_FRAME_ENTER in order to point */
      /* to the composite instructions, if we find some.   */
      /* We will process them later.                       */
      /*                                                   */
      loader->ins_pos = (FT_ULong)( FT_STREAM_POS() +
                                    p - limit );
    }

#endif

    loader->cursor = p;

  Fail:
    return error;

  Invalid_Composite:
    error = FT_THROW( Invalid_Composite );
    goto Fail;
  }